

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_impl.c
# Opt level: O0

size_t appendUnique(uint16_t *list,uint16_t value,size_t position)

{
  size_t i;
  size_t position_local;
  uint16_t value_local;
  uint16_t *list_local;
  size_t local_8;
  
  if (position == 0) {
    *list = value;
    local_8 = 1;
  }
  else {
    for (i = 0; i < position; i = i + 1) {
      if (list[i] == value) {
        return position;
      }
    }
    list[position] = value;
    local_8 = position + 1;
  }
  return local_8;
}

Assistant:

static size_t appendUnique(uint16_t* list, uint16_t value, size_t position) {
  if (position == 0) {
    list[position] = value;
    return position + 1;
  }

  for (size_t i = 0; i < position; i++) {
    if (list[i] == value) {
      return position;
    }
  }
  list[position] = value;
  return position + 1;
}